

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode do_init_reader_stack(Curl_easy *data,Curl_creader *r)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  curl_off_t cVar3;
  Curl_creader *local_20;
  
  (data->req).reader_stack = r;
  cVar3 = (*r->crt->total_length)(data,r);
  if ((cVar3 != 0) &&
     ((((data->set).field_0x89d & 1) != 0 || (((data->state).field_0x7bf & 0x40) != 0)))) {
    local_20 = (Curl_creader *)0x0;
    CVar2 = Curl_creader_create(&local_20,data,&cr_lc,CURL_CR_CONTENT_ENCODE);
    pCVar1 = local_20;
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_creader_add(data,local_20);
    }
    if (pCVar1 != (Curl_creader *)0x0 && CVar2 != CURLE_OK) {
      (*pCVar1->crt->do_close)(data,pCVar1);
      (*Curl_cfree)(pCVar1);
      return CVar2;
    }
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode do_init_reader_stack(struct Curl_easy *data,
                                     struct Curl_creader *r)
{
  CURLcode result = CURLE_OK;
  curl_off_t clen;

  DEBUGASSERT(r);
  DEBUGASSERT(r->crt);
  DEBUGASSERT(r->phase == CURL_CR_CLIENT);
  DEBUGASSERT(!data->req.reader_stack);

  data->req.reader_stack = r;
  clen = r->crt->total_length(data, r);
  /* if we do not have 0 length init, and crlf conversion is wanted,
   * add the reader for it */
  if(clen && (data->set.crlf
#ifdef CURL_PREFER_LF_LINEENDS
     || data->state.prefer_ascii
#endif
    )) {
    result = cr_lc_add(data);
    if(result)
      return result;
  }

  return result;
}